

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

int lws_handshake_server(lws *wsi,uchar **buf,size_t len)

{
  char cVar1;
  allocated_headers *paVar2;
  int iVar3;
  uint code;
  lws_context *context_00;
  char *pcVar4;
  lws_vhost *vh;
  lws_h2_netconn *plVar5;
  size_t sVar6;
  char *up;
  char *uri_ptr;
  int local_290;
  int n_1;
  int ha;
  int uri_len;
  lws_http_mount *hit;
  char *msg;
  char ua [384];
  lws_protocol_vhost_options *rej;
  lws_vhost *vhost;
  lws_parser_return_t local_e0;
  int i;
  int m;
  int n;
  size_t olen;
  char *p;
  char tbuf [128];
  uchar *obuf;
  allocated_headers *ah;
  lws_context_per_thread *pt;
  lws_context *context;
  size_t len_local;
  uchar **buf_local;
  lws *wsi_local;
  
  context_00 = lws_get_context(wsi);
  cVar1 = wsi->tsi;
  tbuf._120_8_ = *buf;
  i = 0;
  _m = len;
  if (9999999 < len) {
    _lws_log(1,"%s: assert: len %ld\n","lws_handshake_server",len);
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/http/server/server.c"
                  ,0x774,"int lws_handshake_server(struct lws *, unsigned char **, size_t)");
  }
  context = (lws_context *)len;
  if ((wsi->http).ah == (allocated_headers *)0x0) {
    _lws_log(1,"%s: assert: NULL ah\n","lws_handshake_server");
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/http/server/server.c"
                  ,0x779,"int lws_handshake_server(struct lws *, unsigned char **, size_t)");
  }
  do {
    if (context == (lws_context *)0x0) {
      return 0;
    }
    if (((wsi->wsistate & 0x20000000) == 0) ||
       ((wsi->role_ops != &role_ops_h1 && (wsi->role_ops != &role_ops_h2)))) {
      _lws_log(1,"%s: bad wsi role 0x%x\n","lws_handshake_server",
               (ulong)(wsi->wsistate & 0xffff0000));
      goto LAB_0015109e;
    }
    iVar3 = (int)context;
    vhost._4_4_ = iVar3;
    local_e0 = lws_parse(wsi,*buf,(int *)((long)&vhost + 4));
    _lws_log(8,"%s: parsed count %d\n","lws_handshake_server",(ulong)(uint)(iVar3 - vhost._4_4_));
    *buf = *buf + (iVar3 - vhost._4_4_);
    context = (lws_context *)(long)vhost._4_4_;
    if (local_e0 == LPR_DO_FALLBACK) goto LAB_001508ac;
    if (local_e0 != LPR_OK) {
      _lws_log(8,"lws_parse failed\n");
      goto LAB_0015109e;
    }
  } while (((wsi->http).ah)->parser_state != 'd');
  _lws_log(0x20,"%s: lws_parse sees parsing complete\n","lws_handshake_server");
  if ((wsi->vhost->listen_port == 0) ||
     (iVar3 = lws_hdr_total_length(wsi,WSI_TOKEN_HOST), iVar3 == 0)) {
    _lws_log(8,"no host\n");
  }
  else {
    iVar3 = wsi->vhost->listen_port;
    pcVar4 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_HOST);
    vh = lws_select_vhost(context_00,iVar3,pcVar4);
    if (vh != (lws_vhost *)0x0) {
      lws_vhost_bind_wsi(vh,wsi);
    }
  }
  if (((wsi->role_ops != &role_ops_h2) || ((wsi->wsistate & 0x20000000) == 0)) &&
     ((*(ulong *)&wsi->field_0x2dc >> 0xf & 1) == 0)) {
    *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc & 0xffffffffffff7fff | 0x8000;
  }
  if (wsi->context->reject_service_keywords != (lws_protocol_vhost_options *)0x0) {
    ua._376_8_ = wsi->context->reject_service_keywords;
    hit = (lws_http_mount *)0x0;
    iVar3 = lws_hdr_copy(wsi,(char *)&msg,0x17f,WSI_TOKEN_HTTP_USER_AGENT);
    if (0 < iVar3) {
      ua[0x177] = '\0';
      for (; ua._376_8_ != 0; ua._376_8_ = *(undefined8 *)ua._376_8_) {
        pcVar4 = strstr((char *)&msg,*(char **)(ua._376_8_ + 0x10));
        if (pcVar4 != (char *)0x0) {
          hit = (lws_http_mount *)strchr(*(char **)(ua._376_8_ + 0x18),0x20);
          if (hit != (lws_http_mount *)0x0) {
            hit = (lws_http_mount *)((long)&hit->mount_next + 1);
          }
          code = atoi(*(char **)(ua._376_8_ + 0x18));
          lws_return_http_status(wsi,code,(char *)hit);
          goto LAB_0015109e;
        }
      }
    }
  }
  _ha = (lws_http_mount *)0x0;
  n_1 = 0;
  up = (char *)0x0;
  uri_ptr._4_4_ = lws_http_get_uri_and_method(wsi,&up,&n_1);
  if (((-1 < uri_ptr._4_4_) && (_ha = lws_find_mount(wsi,up,n_1), _ha != (lws_http_mount *)0x0)) &&
     (uri_ptr._4_4_ = lws_http_redirect_hit(context_00->pt + (int)cVar1,wsi,_ha,up,n_1,&local_290),
     local_290 != 0)) {
    return uri_ptr._4_4_;
  }
  iVar3 = lws_hdr_total_length(wsi,WSI_TOKEN_CONNECT);
  if (iVar3 == 0) {
    lwsi_set_state(wsi,0x20a);
    lws_set_timeout(wsi,NO_PENDING_TIMEOUT,0);
    iVar3 = lws_hdr_total_length(wsi,WSI_TOKEN_UPGRADE);
    if (iVar3 == 0) {
LAB_00150e19:
      _lws_log(8,"%s: %p: No upgrade\n","lws_handshake_server",wsi);
      lwsi_set_state(wsi,0x119);
      (wsi->http).fop_fd = (lws_fop_fd_t)0x0;
      _lws_log(0x10,"%s: wsi %p: ah %p\n","lws_handshake_server",wsi,(wsi->http).ah);
      iVar3 = lws_http_action(wsi);
      return iVar3;
    }
    pcVar4 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_UPGRADE);
    iVar3 = strcasecmp(pcVar4,"websocket");
    if ((iVar3 != 0) && (iVar3 = strcasecmp(pcVar4,"h2c"), iVar3 != 0)) {
      _lws_log(8,"Unknown upgrade \'%s\'\n",pcVar4);
      iVar3 = lws_return_http_status(wsi,0x193,(char *)0x0);
      if ((iVar3 != 0) || (iVar3 = lws_http_transaction_completed(wsi), iVar3 != 0))
      goto LAB_0015109e;
    }
    i = user_callback_handle_rxflow
                  (wsi->protocol->callback,wsi,LWS_CALLBACK_HTTP_CONFIRM_UPGRADE,wsi->user_space,
                   pcVar4,0);
    if (-1 < i) {
      if (i < 1) {
        if (((wsi->vhost->options & 0x8000000) == 0) ||
           (iVar3 = lws_confirm_host_header(wsi), iVar3 == 0)) {
          iVar3 = strcasecmp(pcVar4,"websocket");
          if (iVar3 == 0) {
            _lws_log(8,"Upgrade to ws\n");
            iVar3 = lws_process_ws_upgrade(wsi);
            if (iVar3 == 0) {
              return 0;
            }
          }
          else {
            iVar3 = strcasecmp(pcVar4,"h2c");
            if (iVar3 != 0) goto LAB_00150e19;
            _lws_log(8,"Upgrade to h2c\n");
            iVar3 = lws_hdr_total_length(wsi,WSI_TOKEN_HTTP2_SETTINGS);
            if (iVar3 != 0) {
              _lws_log(8,"h2c upgrade...\n");
              olen = (size_t)lws_hdr_simple_ptr(wsi,WSI_TOKEN_HTTP2_SETTINGS);
              i = lws_b64_decode_string((char *)olen,(char *)&p,0x80);
              if (i < 0) {
                _lws_log(0x20,"HTTP2_SETTINGS too long\n");
                return 1;
              }
              *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc & 0xfffffffffffffffb | 4;
              paVar2 = (wsi->http).ah;
              lws_role_transition(wsi,0x20000000,LRS_H2_AWAIT_PREFACE,&role_ops_h2);
              (wsi->http).ah = paVar2;
              if ((wsi->h2).h2n == (lws_h2_netconn *)0x0) {
                plVar5 = (lws_h2_netconn *)lws_zalloc(0xf8,"h2n");
                (wsi->h2).h2n = plVar5;
                if ((wsi->h2).h2n == (lws_h2_netconn *)0x0) {
                  return 1;
                }
              }
              lws_h2_init(wsi);
              lws_h2_settings(wsi,&((wsi->h2).h2n)->peer_set,(uchar *)&p,i);
              lws_hpack_dynamic_size(wsi,(((wsi->h2).h2n)->peer_set).s[1]);
              strcpy((char *)&p,
                     "HTTP/1.1 101 Switching Protocols\r\nConnection: Upgrade\r\nUpgrade: h2c\r\n\r\n"
                    );
              sVar6 = strlen((char *)&p);
              local_e0 = (lws_parser_return_t)sVar6;
              i = lws_issue_raw(wsi,(uchar *)&p,(long)local_e0);
              if (i != local_e0) {
                _lws_log(0x10,"http2 switch: ERROR writing to socket\n");
                return 1;
              }
              return 0;
            }
            _lws_log(8,"missing http2_settings\n");
          }
        }
      }
      else {
        iVar3 = lws_http_transaction_completed(wsi);
        if (iVar3 == 0) {
          return 0;
        }
      }
    }
  }
  else {
    _lws_log(8,"Changing to RAW mode\n");
    local_e0 = LPR_OK;
LAB_001508ac:
    iVar3 = lws_http_to_fallback(wsi,(uchar *)tbuf._120_8_,_m);
    if (iVar3 == 0) {
      *buf = (uchar *)(tbuf._120_8_ + _m);
      return 0;
    }
    _lws_log(8,"%s: fallback -> close\n","lws_handshake_server");
  }
LAB_0015109e:
  lws_header_table_detach(wsi,1);
  return 1;
}

Assistant:

int
lws_handshake_server(struct lws *wsi, unsigned char **buf, size_t len)
{
	struct lws_context *context = lws_get_context(wsi);
	struct lws_context_per_thread *pt = &context->pt[(int)wsi->tsi];
#if defined(LWS_WITH_HTTP2)
	struct allocated_headers *ah;
#endif
	unsigned char *obuf = *buf;
#if defined(LWS_WITH_HTTP2)
	char tbuf[128], *p;
#endif
	size_t olen = len;
	int n = 0, m, i;

	if (len >= 10000000) {
		lwsl_err("%s: assert: len %ld\n", __func__, (long)len);
		assert(0);
	}

	if (!wsi->http.ah) {
		lwsl_err("%s: assert: NULL ah\n", __func__);
		assert(0);
	}

	while (len) {
		if (!lwsi_role_server(wsi) || !lwsi_role_http(wsi)) {
			lwsl_err("%s: bad wsi role 0x%x\n", __func__,
					(int)lwsi_role(wsi));
			goto bail_nuke_ah;
		}

		i = (int)len;
		m = lws_parse(wsi, *buf, &i);
		lwsl_info("%s: parsed count %d\n", __func__, (int)len - i);
		(*buf) += (int)len - i;
		len = i;

		if (m == LPR_DO_FALLBACK) {

			/*
			 * http parser went off the rails and
			 * LWS_SERVER_OPTION_FALLBACK_TO_APPLY_LISTEN_
			 * ACCEPT_CONFIG is set on this vhost.
			 *
			 * We are transitioning from http with an AH, to
			 * a backup role (raw-skt, by default).  Drop
			 * the ah, bind to the role with mode as
			 * ESTABLISHED.
			 */
raw_transition:

			if (lws_http_to_fallback(wsi, obuf, olen)) {
				lwsl_info("%s: fallback -> close\n", __func__);
				goto bail_nuke_ah;
			}

			(*buf) = obuf + olen;

			return 0;
		}
		if (m) {
			lwsl_info("lws_parse failed\n");
			goto bail_nuke_ah;
		}

		if (wsi->http.ah->parser_state != WSI_PARSING_COMPLETE)
			continue;

		lwsl_parser("%s: lws_parse sees parsing complete\n", __func__);

		/* select vhost */

		if (wsi->vhost->listen_port &&
		    lws_hdr_total_length(wsi, WSI_TOKEN_HOST)) {
			struct lws_vhost *vhost = lws_select_vhost(
				context, wsi->vhost->listen_port,
				lws_hdr_simple_ptr(wsi, WSI_TOKEN_HOST));

			if (vhost)
				lws_vhost_bind_wsi(vhost, wsi);
		} else
			lwsl_info("no host\n");

		if (!lwsi_role_h2(wsi) || !lwsi_role_server(wsi)) {
#if defined(LWS_WITH_SERVER_STATUS)
			wsi->vhost->conn_stats.h1_trans++;
#endif
			if (!wsi->conn_stat_done) {
#if defined(LWS_WITH_SERVER_STATUS)
				wsi->vhost->conn_stats.h1_conn++;
#endif
				wsi->conn_stat_done = 1;
			}
		}

		/* check for unwelcome guests */

		if (wsi->context->reject_service_keywords) {
			const struct lws_protocol_vhost_options *rej =
					wsi->context->reject_service_keywords;
			char ua[384], *msg = NULL;

			if (lws_hdr_copy(wsi, ua, sizeof(ua) - 1,
					 WSI_TOKEN_HTTP_USER_AGENT) > 0) {
#ifdef LWS_WITH_ACCESS_LOG
				char *uri_ptr = NULL;
				int meth, uri_len;
#endif
				ua[sizeof(ua) - 1] = '\0';
				while (rej) {
					if (!strstr(ua, rej->name)) {
						rej = rej->next;
						continue;
					}

					msg = strchr(rej->value, ' ');
					if (msg)
						msg++;
					lws_return_http_status(wsi,
						atoi(rej->value), msg);
#ifdef LWS_WITH_ACCESS_LOG
					meth = lws_http_get_uri_and_method(wsi,
							&uri_ptr, &uri_len);
					if (meth >= 0)
						lws_prepare_access_log_info(wsi,
							uri_ptr, uri_len, meth);

					/* wsi close will do the log */
#endif
#if defined(LWS_WITH_SERVER_STATUS)
					wsi->vhost->conn_stats.rejected++;
#endif
					/*
					 * We don't want anything from
					 * this rejected guy.  Follow
					 * the close flow, not the
					 * transaction complete flow.
					 */
					goto bail_nuke_ah;
				}
			}
		}

		/*
		 * So he may have come to us requesting one or another kind
		 * of upgrade from http... but we may want to redirect him at
		 * http level.  In that case, we need to check the redirect
		 * situation even though he's not actually wanting http and
		 * prioritize returning that if there is one.
		 */

		{
			const struct lws_http_mount *hit = NULL;
			int uri_len = 0, ha, n;
			char *uri_ptr = NULL;

			n = lws_http_get_uri_and_method(wsi, &uri_ptr, &uri_len);
			if (n >= 0) {
				hit = lws_find_mount(wsi, uri_ptr, uri_len);
				if (hit) {
					n = lws_http_redirect_hit(pt, wsi, hit, uri_ptr,
								  uri_len, &ha);
					if (ha)
						return n;
				}
			}
		}



		if (lws_hdr_total_length(wsi, WSI_TOKEN_CONNECT)) {
			lwsl_info("Changing to RAW mode\n");
			m = 0;
			goto raw_transition;
		}

		lwsi_set_state(wsi, LRS_PRE_WS_SERVING_ACCEPT);
		lws_set_timeout(wsi, NO_PENDING_TIMEOUT, 0);

		if (lws_hdr_total_length(wsi, WSI_TOKEN_UPGRADE)) {

			const char *up = lws_hdr_simple_ptr(wsi,
							    WSI_TOKEN_UPGRADE);

			if (strcasecmp(up, "websocket") &&
			    strcasecmp(up, "h2c")) {
				lwsl_info("Unknown upgrade '%s'\n", up);

				if (lws_return_http_status(wsi,
						HTTP_STATUS_FORBIDDEN, NULL) ||
				    lws_http_transaction_completed(wsi))
					goto bail_nuke_ah;
			}

			n = user_callback_handle_rxflow(wsi->protocol->callback,
					wsi, LWS_CALLBACK_HTTP_CONFIRM_UPGRADE,
					wsi->user_space, (char *)up, 0);

			/* just hang up? */

			if (n < 0)
				goto bail_nuke_ah;

			/* callback returned headers already, do t_c? */

			if (n > 0) {
				if (lws_http_transaction_completed(wsi))
					goto bail_nuke_ah;

				/* continue on */

				return 0;
			}

			/* callback said 0, it was allowed */

			if (wsi->vhost->options &
			    LWS_SERVER_OPTION_VHOST_UPG_STRICT_HOST_CHECK &&
			    lws_confirm_host_header(wsi))
				goto bail_nuke_ah;

			if (!strcasecmp(up, "websocket")) {
#if defined(LWS_ROLE_WS)
#if defined(LWS_WITH_SERVER_STATUS)
				wsi->vhost->conn_stats.ws_upg++;
#endif
				lwsl_info("Upgrade to ws\n");
				goto upgrade_ws;
#endif
			}
#if defined(LWS_WITH_HTTP2)
			if (!strcasecmp(up, "h2c")) {
#if defined(LWS_WITH_SERVER_STATUS)
				wsi->vhost->conn_stats.h2_upg++;
#endif
				lwsl_info("Upgrade to h2c\n");
				goto upgrade_h2c;
			}
#endif
		}

		/* no upgrade ack... he remained as HTTP */

		lwsl_info("%s: %p: No upgrade\n", __func__, wsi);

		lwsi_set_state(wsi, LRS_ESTABLISHED);
#if defined(LWS_WITH_FILE_OPS)
		wsi->http.fop_fd = NULL;
#endif

#if defined(LWS_WITH_HTTP_STREAM_COMPRESSION)
		lws_http_compression_validate(wsi);
#endif

		lwsl_debug("%s: wsi %p: ah %p\n", __func__, (void *)wsi,
			   (void *)wsi->http.ah);

		n = lws_http_action(wsi);

		return n;

#if defined(LWS_WITH_HTTP2)
upgrade_h2c:
		if (!lws_hdr_total_length(wsi, WSI_TOKEN_HTTP2_SETTINGS)) {
			lwsl_info("missing http2_settings\n");
			goto bail_nuke_ah;
		}

		lwsl_info("h2c upgrade...\n");

		p = lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP2_SETTINGS);
		/* convert the peer's HTTP-Settings */
		n = lws_b64_decode_string(p, tbuf, sizeof(tbuf));
		if (n < 0) {
			lwsl_parser("HTTP2_SETTINGS too long\n");
			return 1;
		}

		wsi->upgraded_to_http2 = 1;

		/* adopt the header info */

		ah = wsi->http.ah;
		lws_role_transition(wsi, LWSIFR_SERVER, LRS_H2_AWAIT_PREFACE,
				    &role_ops_h2);

		/* http2 union member has http union struct at start */
		wsi->http.ah = ah;

		if (!wsi->h2.h2n) {
			wsi->h2.h2n = lws_zalloc(sizeof(*wsi->h2.h2n), "h2n");
			if (!wsi->h2.h2n)
				return 1;
		}

		lws_h2_init(wsi);

		/* HTTP2 union */

		lws_h2_settings(wsi, &wsi->h2.h2n->peer_set, (uint8_t *)tbuf, n);

		lws_hpack_dynamic_size(wsi, wsi->h2.h2n->peer_set.s[
		                                      H2SET_HEADER_TABLE_SIZE]);

		strcpy(tbuf, "HTTP/1.1 101 Switching Protocols\x0d\x0a"
			      "Connection: Upgrade\x0d\x0a"
			      "Upgrade: h2c\x0d\x0a\x0d\x0a");
		m = (int)strlen(tbuf);
		n = lws_issue_raw(wsi, (unsigned char *)tbuf, m);
		if (n != m) {
			lwsl_debug("http2 switch: ERROR writing to socket\n");
			return 1;
		}

		return 0;
#endif
#if defined(LWS_ROLE_WS)
upgrade_ws:
		if (lws_process_ws_upgrade(wsi))
			goto bail_nuke_ah;

		return 0;
#endif
	} /* while all chars are handled */

	return 0;

bail_nuke_ah:
	/* drop the header info */
	lws_header_table_detach(wsi, 1);

	return 1;
}